

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O1

void okim6295_w(void *info,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar5;
  undefined7 in_register_00000031;
  undefined8 uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  
  switch(CONCAT71(in_register_00000031,offset) & 0xffffffff) {
  case 0:
    if (*(short *)((long)info + 200) == -1) {
      if ((char)data < '\0') {
        *(ushort *)((long)info + 200) = (ushort)(data & 0x7f);
      }
      else {
        bVar1 = data >> 3;
        lVar7 = 0x20;
        do {
          if ((bVar1 & 1) != 0) {
            *(undefined1 *)((long)info + lVar7) = 0;
          }
          bVar1 = bVar1 >> 1;
          lVar7 = lVar7 + 0x30;
        } while (lVar7 != 0xe0);
      }
    }
    else {
      uVar5 = (ulong)(data >> 4);
      lVar7 = 0;
      do {
        if (((uVar5 & 1) != 0) && (*(char *)((long)info + lVar7 + 0x20) == '\0')) {
          iVar9 = (int)*(short *)((long)info + 200);
          bVar1 = memory_raw_read_byte((okim6295_state *)info,iVar9 * 8);
          bVar2 = memory_raw_read_byte((okim6295_state *)info,iVar9 * 8 + 1);
          bVar3 = memory_raw_read_byte((okim6295_state *)info,iVar9 * 8 + 2);
          uVar8 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          bVar1 = memory_raw_read_byte((okim6295_state *)info,iVar9 * 8 + 3);
          bVar2 = memory_raw_read_byte((okim6295_state *)info,iVar9 * 8 + 4);
          bVar3 = memory_raw_read_byte((okim6295_state *)info,iVar9 * 8 + 5);
          uVar4 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          iVar9 = uVar4 - uVar8;
          if (uVar4 < uVar8 || iVar9 == 0) {
            *(undefined1 *)((long)info + lVar7 + 0x20) = 0;
          }
          else {
            *(undefined1 *)((long)info + lVar7 + 0x20) = 1;
            *(uint *)((long)info + lVar7 + 0x24) = uVar8;
            *(undefined4 *)((long)info + lVar7 + 0x28) = 0;
            *(int *)((long)info + lVar7 + 0x2c) = iVar9 * 2 + 2;
            oki_adpcm_reset((oki_adpcm_state *)((long)info + lVar7 + 8));
            *(int *)((long)info + lVar7 + 0x30) = volume_table[data & 0xf];
          }
        }
        uVar5 = uVar5 >> 1;
        lVar7 = lVar7 + 0x30;
      } while (lVar7 != 0xc0);
      *(undefined2 *)((long)info + 200) = 0xffff;
    }
    break;
  case 8:
    *(UINT8 *)((long)info + 0xd8) = data;
    break;
  case 9:
    *(UINT8 *)((long)info + 0xd9) = data;
    break;
  case 10:
    *(UINT8 *)((long)info + 0xda) = data;
    break;
  case 0xb:
    uVar4 = (uint)data << 0x18 | *(uint *)((long)info + 0xd8) & 0xffffff;
    *(uint *)((long)info + 0xd8) = uVar4;
    UNRECOVERED_JUMPTABLE = *(code **)((long)info + 0xf0);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar8 = 0x84;
      if (*(char *)((long)info + 0xd0) == '\0') {
        uVar8 = 0xa5;
      }
      uVar6 = *(undefined8 *)((long)info + 0xf8);
LAB_001647db:
      (*UNRECOVERED_JUMPTABLE)(uVar6,(ulong)uVar4 / (ulong)uVar8,(ulong)uVar4 % (ulong)uVar8);
      return;
    }
    break;
  case 0xc:
    *(UINT8 *)((long)info + 0xd0) = data;
    UNRECOVERED_JUMPTABLE = *(code **)((long)info + 0xf0);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar8 = 0x84;
      if (data == '\0') {
        uVar8 = 0xa5;
      }
      uVar6 = *(undefined8 *)((long)info + 0xf8);
      uVar4 = *(uint *)((long)info + 0xd8);
      goto LAB_001647db;
    }
    break;
  case 0xe:
    *(UINT8 *)((long)info + 0xd2) = data;
    break;
  case 0xf:
    *(uint *)((long)info + 0xcc) = (uint)data << 0x12;
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    *(UINT8 *)((long)info + (ulong)(offset & 3) + 0xd3) = data;
  }
  return;
}

Assistant:

static void okim6295_w(void* info, UINT8 offset, UINT8 data)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	switch(offset)
	{
	case 0x00:
		okim6295_write_command(chip, data);
		break;
	case 0x08:
		chip->master_clock &= ~0x000000FF;
		chip->master_clock |= data <<  0;
		break;
	case 0x09:
		chip->master_clock &= ~0x0000FF00;
		chip->master_clock |= data <<  8;
		break;
	case 0x0A:
		chip->master_clock &= ~0x00FF0000;
		chip->master_clock |= data << 16;
		break;
	case 0x0B:
		chip->master_clock &= ~0xFF000000;
		chip->master_clock |= data << 24;
		okim6295_clock_changed(chip);
		break;
	case 0x0C:
		okim6295_set_pin7(chip, data);
		break;
	case 0x0E:	// NMK112 bank switch enable
		chip->nmk_mode = data;
		break;
	case 0x0F:
		okim6295_set_bank_base(chip, data << 18);
		break;
	case 0x10:
	case 0x11:
	case 0x12:
	case 0x13:
		chip->nmk_bank[offset & 0x03] = data;
		break;
	}
	
	return;
}